

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O2

int lws_sa46_write_numeric_address(lws_sockaddr46 *sa46,char *buf,size_t len)

{
  int iVar1;
  
  *buf = '\0';
  if ((sa46->sa4).sin_family == 2) {
    iVar1 = lws_write_numeric_address((uint8_t *)&(sa46->sa4).sin_addr,4,buf,len);
    return iVar1;
  }
  return -1;
}

Assistant:

int
lws_sa46_write_numeric_address(lws_sockaddr46 *sa46, char *buf, size_t len)
{
	*buf = '\0';
#if defined(LWS_WITH_IPV6)
	if (sa46->sa4.sin_family == AF_INET6)
		return lws_write_numeric_address(
				(uint8_t *)&sa46->sa6.sin6_addr, 16, buf, len);
#endif
	if (sa46->sa4.sin_family == AF_INET)
		return lws_write_numeric_address(
				(uint8_t *)&sa46->sa4.sin_addr, 4, buf, len);

	return -1;
}